

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O0

bool __thiscall cmMessenger::GetSuppressDevWarnings(cmMessenger *this)

{
  cmState *this_00;
  bool bVar1;
  char *val;
  allocator local_39;
  string local_38;
  char *local_18;
  char *cacheEntryValue;
  cmMessenger *this_local;
  
  this_00 = this->State;
  cacheEntryValue = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_39);
  val = cmState::GetCacheEntryValue(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = val;
  bVar1 = cmSystemTools::IsOn(val);
  return bVar1;
}

Assistant:

bool cmMessenger::GetSuppressDevWarnings() const
{
  const char* cacheEntryValue =
    this->State->GetCacheEntryValue("CMAKE_SUPPRESS_DEVELOPER_WARNINGS");
  return cmSystemTools::IsOn(cacheEntryValue);
}